

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O1

Var Js::TaggedInt::Modulus(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 *puVar7;
  
  if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b1a070;
    *puVar3 = 0;
  }
  if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar2) goto LAB_00b1a070;
    *puVar3 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b1a070;
    *puVar3 = 0;
  }
  uVar4 = (uint)aRight;
  if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar2) {
LAB_00b1a070:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar5 = (uint)aLeft;
  if ((((int)uVar5 < 1) || ((int)uVar4 < 1)) || ((uVar4 + 0x7fffffff & uVar4) != 0)) {
    if (uVar4 == 0) {
      return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nan.ptr;
    }
    if (uVar5 != 0) {
      uVar6 = 0;
      if (uVar4 != 0xffffffff || uVar5 != 0x80000000) {
        uVar6 = (uint)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | (ulong)aLeft & 0xffffffff)
                      % (long)(int)uVar4);
      }
      if (uVar6 != 0) goto LAB_00b1a02f;
      if ((int)uVar5 < 0) {
        return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).negativeZero.ptr;
      }
    }
    puVar7 = &DAT_1000000000000;
  }
  else {
    uVar6 = uVar5 & uVar4 - 1 & 0x7fffffff;
LAB_00b1a02f:
    puVar7 = (undefined1 *)((ulong)uVar6 | 0x1000000000000);
  }
  return puVar7;
}

Assistant:

Var TaggedInt::Modulus(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        int nLeft    = ToInt32(aLeft);
        int nRight   = ToInt32(aRight);

        // nLeft is positive and nRight is +2^i
        // Fast path for Power of 2 divisor
        if (nLeft > 0 && ::Math::IsPow2(nRight))
        {
            return ToVarUnchecked(nLeft & (nRight - 1));
        }

        if (nRight == 0)
        {
            return scriptContext->GetLibrary()->GetNaN();
        }

        if (nLeft == 0)
        {
          return ToVarUnchecked(0);
        }
        int result;
#if INT32VAR
        // 0x80000000 / -1 (or %) will trigger an integer overflow exception
        if (nLeft != INT_MIN || nRight != -1)
        {
#endif
            result = nLeft % nRight;

#if INT32VAR
        }
        else
        {
            int64 left64 = nLeft;
            int64 right64 = nRight;
            result = (int)(left64 % right64);
        }
#endif
        if (result != 0)
        {
            return ToVarUnchecked(result);
        }
        else
        {
            //
            // return -0 if left is negative
            //

            if (nLeft >= 0)
            {
                return ToVarUnchecked(0);
            }
            else
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
        }
    }